

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

int __thiscall
Fl_Graphics_Driver::clip_box
          (Fl_Graphics_Driver *this,int x,int y,int w,int h,int *X,int *Y,int *W,int *H)

{
  Fl_Region p_Var1;
  int iVar2;
  Fl_Region p_Var3;
  undefined8 uVar4;
  int iVar5;
  undefined4 in_register_00000034;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  short local_38;
  short local_36;
  ushort local_34;
  ushort local_32;
  
  *X = x;
  *Y = y;
  *W = w;
  *H = h;
  p_Var1 = this->rstack[this->rstackptr];
  iVar5 = 0;
  if (p_Var1 != (Fl_Region)0x0) {
    iVar2 = XRectInRegion(p_Var1,CONCAT44(in_register_00000034,x),y,w);
    iVar5 = 0;
    if (iVar2 != 1) {
      if (iVar2 == 0) {
        *H = 0;
        *W = 0;
        iVar5 = 2;
      }
      else {
        p_Var3 = XRectangleRegion(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0,0x1f3cf0);
        uVar4 = XCreateRegion();
        XIntersectRegion(p_Var1,p_Var3,uVar4);
        XClipBox(uVar4,&local_38);
        *X = (int)local_38;
        *Y = (int)local_36;
        *W = (uint)local_34;
        *H = (uint)local_32;
        XDestroyRegion(uVar4);
        XDestroyRegion(p_Var3);
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int Fl_Graphics_Driver::clip_box(int x, int y, int w, int h, int& X, int& Y, int& W, int& H){
  X = x; Y = y; W = w; H = h;
  Fl_Region r = rstack[rstackptr];
  if (!r) return 0;
#if defined(USE_X11)
  switch (XRectInRegion(r, x, y, w, h)) {
  case 0: // completely outside
    W = H = 0;
    return 2;
  case 1: // completely inside:
    return 0;
  default: // partial:
    break;
  }
  Fl_Region rr = XRectangleRegion(x,y,w,h);
  Fl_Region temp = XCreateRegion();
  XIntersectRegion(r, rr, temp);
  XRectangle rect;
  XClipBox(temp, &rect);
  X = rect.x; Y = rect.y; W = rect.width; H = rect.height;
  XDestroyRegion(temp);
  XDestroyRegion(rr);
  return 1;
#elif defined(WIN32)
// The win32 API makes no distinction between partial and complete
// intersection, so we have to check for partial intersection ourselves.
// However, given that the regions may be composite, we have to do
// some voodoo stuff...
  Fl_Region rr = XRectangleRegion(x,y,w,h);
  Fl_Region temp = CreateRectRgn(0,0,0,0);
  int ret;
  if (CombineRgn(temp, rr, r, RGN_AND) == NULLREGION) { // disjoint
    W = H = 0;
    ret = 2;
  } else if (EqualRgn(temp, rr)) { // complete
    ret = 0;
  } else {	// partial intersection
    RECT rect;
    GetRgnBox(temp, &rect);
    if (Fl_Surface_Device::surface() != Fl_Display_Device::display_device()) { // if print context, convert coords from device to logical
      POINT pt[2] = { {rect.left, rect.top}, {rect.right, rect.bottom} };
      DPtoLP(fl_gc, pt, 2);
      X = pt[0].x; Y = pt[0].y; W = pt[1].x - X; H = pt[1].y - Y;
    }
    else {
      X = rect.left; Y = rect.top; W = rect.right - X; H = rect.bottom - Y;
      }
    ret = 1;
  }
  DeleteObject(temp);
  DeleteObject(rr);
  return ret;
#elif defined(__APPLE_QUARTZ__)
  CGRect arg = fl_cgrectmake_cocoa(x, y, w, h);
  CGRect u = CGRectMake(0,0,0,0);
  CGRect test;
  for(int i = 0; i < r->count; i++) {
    test = CGRectIntersection(r->rects[i], arg);
    if( ! CGRectIsEmpty(test) ) {
      if(CGRectIsEmpty(u)) u = test;
      else u = CGRectUnion(u, test);
    }
  }
  X = int(u.origin.x + 0.5); // reverse offset introduced by fl_cgrectmake_cocoa()
  Y = int(u.origin.y + 0.5);
  W = int(u.size.width + 0.5); // round to nearest integer
  H = int(u.size.height + 0.5);
  if(CGRectIsEmpty(u)) W = H = 0;
  return ! CGRectEqualToRect(arg, u);
#else
# error unsupported platform
#endif
}